

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
dynet::PickRange::autobatch_concat
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,PickRange *this,
          ComputationGraph *cg)

{
  pointer piVar1;
  
  piVar1 = (pointer)operator_new(4);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar1 + 1;
  *piVar1 = 1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<int> autobatch_concat(const ComputationGraph & cg) const override { return std::vector<int>(1, 1); }